

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void newBinNE(IntView<0> x,IntView<0> y,BoolView *r)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  BinNE<0,_0,_0> *this;
  BinNE<0,_4,_0> *this_00;
  uint uVar4;
  uint uVar5;
  IntVar *pIVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  IntVar *pIVar10;
  uint uVar11;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<4> _y_01;
  IntView<4> _y_02;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  uVar7 = y._8_8_;
  pIVar6 = y.var;
  uVar9 = x._8_8_;
  pIVar10 = x.var;
  uVar8 = x.a;
  uVar3 = -uVar8;
  if (0 < (int)uVar8) {
    uVar3 = uVar8;
  }
  uVar8 = (uint)(uVar9 >> 0x1f) & 1;
  uVar11 = uVar8 + 2;
  if (uVar3 < 2) {
    uVar11 = uVar8;
  }
  uVar8 = uVar11 + 4;
  if (uVar9 >> 0x20 == 0) {
    uVar8 = uVar11;
  }
  uVar4 = y.a;
  uVar11 = -uVar4;
  if (0 < (int)uVar4) {
    uVar11 = uVar4;
  }
  uVar4 = (uint)(uVar7 >> 0x1f) & 1;
  uVar5 = uVar4 + 2;
  if (uVar11 < 2) {
    uVar5 = uVar4;
  }
  uVar4 = uVar5 + 4;
  if (uVar7 >> 0x20 == 0) {
    uVar4 = uVar5;
  }
  if (uVar4 == 0 && uVar8 == 0) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this = (BinNE<0,_0,_0> *)operator_new(0x50);
    _x._8_8_ = (ulong)uVar3 | uVar9 & 0xffffffff00000000;
    _y._8_8_ = (ulong)uVar11 | uVar7 & 0xffffffff00000000;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_40.v = r->v;
      local_40.s = r->s;
      _x.var = pIVar10;
      _y.var = pIVar6;
      BinNE<0,_0,_0>::BinNE(this,_x,_y,&local_40);
    }
    else {
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_50.v = r->v;
      local_50.s = r->s;
      _x_00.a = (int)_x._8_8_;
      _x_00.b = (int)(_x._8_8_ >> 0x20);
      _x_00.var = pIVar10;
      _y_00.a = (int)_y._8_8_;
      _y_00.b = (int)(_y._8_8_ >> 0x20);
      _y_00.var = pIVar6;
      BinNE<0,_0,_1>::BinNE((BinNE<0,_0,_1> *)this,_x_00,_y_00,&local_50);
    }
  }
  if ((uVar8 == 0) && (uVar4 == 4)) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this_00 = (BinNE<0,_4,_0> *)operator_new(0x50);
    _x_01._8_8_ = uVar9 & 0xffffffff00000000 | (ulong)uVar3;
    uVar7 = uVar7 & 0xffffffff00000000 | (ulong)uVar11;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_60.v = r->v;
      local_60.s = r->s;
      _x_01.var = pIVar10;
      _y_01.a = (int)uVar7;
      _y_01.b = (int)(uVar7 >> 0x20);
      _y_01.var = pIVar6;
      BinNE<0,_4,_0>::BinNE(this_00,_x_01,_y_01,&local_60);
    }
    else {
      local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_70.v = r->v;
      local_70.s = r->s;
      _x_02.a = (int)_x_01._8_8_;
      _x_02.b = (int)(_x_01._8_8_ >> 0x20);
      _x_02.var = pIVar10;
      _y_02.a = (int)uVar7;
      _y_02.b = (int)(uVar7 >> 0x20);
      _y_02.var = pIVar6;
      BinNE<0,_4,_1>::BinNE((BinNE<0,_4,_1> *)this_00,_x_02,_y_02,&local_70);
    }
  }
  return;
}

Assistant:

void newBinNE(IntView<> x, IntView<> y, const BoolView& r = bv_true) {
	const int u = x.getType();
	const int v = y.getType();
	Propagator* p = nullptr;

	BinProp(BinNE, 0, 0);
	BinProp(BinNE, 0, 4);

	assert(p);
}